

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zvgEnc.c
# Opt level: O2

void zvgEnc(int xStart,int yStart,int xEnd,int yEnd)

{
  bool bVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  byte bVar4;
  uint uVar5;
  bool bVar6;
  bool bVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  byte bVar13;
  uint uVar14;
  byte bVar15;
  byte bVar16;
  uchar uVar17;
  uint xStart_00;
  int iVar18;
  byte bVar19;
  uint uVar20;
  uchar uVar21;
  uint yStart_00;
  uint uVar22;
  int iVar23;
  long pp;
  long lVar24;
  long pp_00;
  long u2;
  long u1;
  long local_48;
  long local_40;
  uint local_34;
  
  uVar8 = ZvgENC.encFlags;
  ZvgENC.vecCount = ZvgENC.vecCount + 1;
  xStart_00 = -(ZvgENC.encFlags & 1) ^ xStart;
  uVar22 = -(ZvgENC.encFlags & 1) ^ xEnd;
  uVar14 = (int)(ZvgENC.encFlags << 0x1e) >> 0x1f;
  yStart_00 = uVar14 ^ yStart;
  uVar14 = uVar14 ^ yEnd;
  if (yStart != yEnd && xStart != xEnd) {
    lVar24 = (long)(int)xStart_00;
    local_40 = 0;
    local_48 = 0x10000;
    pp = (int)uVar22 - lVar24;
    local_34 = xStart_00;
    iVar23 = clipTest(-pp,lVar24 - ZvgENC.xMinClip,&local_40,&local_48);
    if (iVar23 == 0) {
      return;
    }
    iVar23 = clipTest(pp,ZvgENC.xMaxClip - lVar24,&local_40,&local_48);
    if (iVar23 == 0) {
      return;
    }
    lVar24 = (long)(int)yStart_00;
    pp_00 = (int)uVar14 - lVar24;
    iVar23 = clipTest(-pp_00,lVar24 - ZvgENC.yMinClip,&local_40,&local_48);
    if (iVar23 == 0) {
      return;
    }
    iVar23 = clipTest(pp_00,ZvgENC.yMaxClip - lVar24,&local_40,&local_48);
    if (iVar23 == 0) {
      return;
    }
    if (local_48 < 0x10000) {
      uVar22 = (int)((ulong)(local_48 * pp + 0x8000) >> 0x10) + local_34;
      uVar14 = (int)((ulong)(local_48 * pp_00 + 0x8000) >> 0x10) + yStart_00;
    }
    xStart_00 = local_34;
    if (0 < local_40) {
      xStart_00 = local_34 + (int)((ulong)(pp * local_40 + 0x8000) >> 0x10);
      yStart_00 = yStart_00 + (int)((ulong)(pp_00 * local_40 + 0x8000) >> 0x10);
    }
  }
  if ((uVar22 == xStart_00) && (uVar14 == yStart_00)) {
    if ((int)xStart_00 < ZvgENC.xMinClip) {
      return;
    }
    if (ZvgENC.xMaxClip < (int)xStart_00) {
      return;
    }
    if ((int)yStart_00 < ZvgENC.yMinClip) {
      return;
    }
    if (ZvgENC.yMaxClip < (int)yStart_00) {
      return;
    }
LAB_00102a1a:
    zvgEncPointSK(xStart_00,yStart_00,ZvgENC.encColor);
    return;
  }
  uVar9 = uVar14 - yStart_00;
  bVar15 = (ZvgENC.encColor != ZvgENC.zColor) * '@';
  bVar6 = ZvgENC.yPos != yStart_00;
  bVar7 = ZvgENC.xPos != xStart_00;
  bVar4 = bVar15 | 0x90;
  if (!bVar6 && !bVar7) {
    bVar4 = bVar15 + 0x10;
  }
  uVar20 = uVar22 - xStart_00;
  bVar1 = (int)uVar22 < (int)xStart_00;
  uVar5 = -uVar20;
  if (0 < (int)uVar20) {
    uVar5 = uVar20;
  }
  uVar11 = CONCAT44(0,uVar5);
  uVar10 = -uVar9;
  if (0 < (int)uVar9) {
    uVar10 = uVar9;
  }
  iVar23 = uVar14 - yStart_00;
  bVar2 = (int)uVar14 < (int)yStart_00;
  uVar21 = (uchar)yStart_00;
  bVar15 = (byte)(yStart_00 >> 8);
  if (iVar23 == 0) {
    if ((int)yStart_00 < ZvgENC.yMinClip) {
      return;
    }
    if (ZvgENC.yMaxClip < (int)yStart_00) {
      return;
    }
    if ((int)uVar22 < (int)xStart_00) {
      if (ZvgENC.xMaxClip < (int)uVar22) {
        return;
      }
      if ((int)xStart_00 < ZvgENC.xMinClip) {
        return;
      }
      iVar23 = ZvgENC.xMinClip - uVar22;
      uVar14 = ZvgENC.xMinClip;
      if (iVar23 < 1) {
        iVar23 = 0;
        uVar14 = uVar22;
      }
      uVar10 = xStart_00 - (iVar23 + uVar22);
      uVar22 = uVar14;
      if (bVar6 || bVar7) {
        iVar23 = xStart_00 - ZvgENC.xMaxClip;
        if (0 < iVar23) {
          xStart_00 = ZvgENC.xMaxClip;
        }
        iVar18 = 0;
        if (0 < iVar23) {
          iVar18 = iVar23;
        }
        uVar10 = uVar10 - iVar18;
      }
    }
    else {
      if ((int)uVar22 < ZvgENC.xMinClip) {
        return;
      }
      if (ZvgENC.xMaxClip < (int)xStart_00) {
        return;
      }
      iVar23 = uVar22 - ZvgENC.xMaxClip;
      uVar14 = ZvgENC.xMaxClip;
      if (iVar23 < 1) {
        iVar23 = 0;
        uVar14 = uVar22;
      }
      uVar22 = uVar14;
      uVar10 = uVar20 - iVar23;
      if (bVar6 || bVar7) {
        iVar23 = ZvgENC.xMinClip - xStart_00;
        if (0 < iVar23) {
          xStart_00 = ZvgENC.xMinClip;
        }
        iVar18 = 0;
        if (0 < iVar23) {
          iVar18 = iVar23;
        }
        uVar10 = uVar10 - iVar18;
      }
    }
    if (uVar10 == 0) goto LAB_00102a1a;
    if ((uVar8 & 4) != 0) {
      if ((int)xStart_00 < ZvgENC.xMinSpot) {
        ZvgENC.xMinSpot = xStart_00;
      }
      if (ZvgENC.xMaxSpot < (int)xStart_00) {
        ZvgENC.xMaxSpot = xStart_00;
      }
      if ((int)uVar22 < ZvgENC.xMinSpot) {
        ZvgENC.xMinSpot = uVar22;
      }
      if (ZvgENC.xMaxSpot < (int)uVar22) {
        ZvgENC.xMaxSpot = uVar22;
      }
      if ((int)yStart_00 < ZvgENC.yMinSpot) {
        ZvgENC.yMinSpot = yStart_00;
      }
      if (ZvgENC.yMaxSpot < (int)yStart_00) {
        ZvgENC.yMaxSpot = yStart_00;
      }
    }
    bVar13 = bVar4 | 0x20;
    if (0xff < uVar10) {
      bVar13 = bVar4;
    }
    uVar11 = (ulong)ZvgENC.encCount;
    ZvgENC.encCount = ZvgENC.encCount + 1;
    ZvgENC.encBfr[uVar11] = bVar1 | bVar13 | 4;
    if ((bVar13 & 0x40) != 0) {
      uVar11 = (ulong)ZvgENC.encCount;
      ZvgENC.encCount = ZvgENC.encCount + 1;
      ZvgENC.encBfr[uVar11] = ZvgENC.encColor._1_1_;
      uVar11 = (ulong)ZvgENC.encCount;
      ZvgENC.encCount = ZvgENC.encCount + 1;
      ZvgENC.encBfr[uVar11] = (uchar)ZvgENC.encColor;
    }
    if (0x7f < bVar13) {
      uVar11 = (ulong)ZvgENC.encCount;
      ZvgENC.encCount = ZvgENC.encCount + 1;
      ZvgENC.encBfr[uVar11] = (uchar)xStart_00;
      uVar11 = (ulong)ZvgENC.encCount;
      ZvgENC.encCount = ZvgENC.encCount + 1;
      ZvgENC.encBfr[uVar11] = bVar15 & 0xf | (byte)(xStart_00 >> 4) & 0xf0;
      uVar11 = (ulong)ZvgENC.encCount;
      ZvgENC.encCount = ZvgENC.encCount + 1;
      ZvgENC.encBfr[uVar11] = uVar21;
    }
    if ((bVar13 & 0x20) == 0) {
      bVar13 = (byte)(uVar10 >> 8) & 0xf;
      goto LAB_001031ee;
    }
  }
  else {
    uVar17 = (uchar)xStart_00;
    if (uVar22 == xStart_00) {
      if ((int)xStart_00 < ZvgENC.xMinClip) {
        return;
      }
      if (ZvgENC.xMaxClip < (int)xStart_00) {
        return;
      }
      if ((int)uVar14 < (int)yStart_00) {
        if (ZvgENC.yMaxClip < (int)uVar14) {
          return;
        }
        if ((int)yStart_00 < ZvgENC.yMinClip) {
          return;
        }
        iVar23 = ZvgENC.yMinClip - uVar14;
        uVar22 = ZvgENC.yMinClip;
        if (iVar23 < 1) {
          iVar23 = 0;
          uVar22 = uVar14;
        }
        uVar9 = yStart_00 - (iVar23 + uVar14);
        uVar11 = (ulong)uVar9;
        uVar14 = uVar22;
        if (bVar6 || bVar7) {
          iVar23 = yStart_00 - ZvgENC.yMaxClip;
          if (0 < iVar23) {
            yStart_00 = ZvgENC.yMaxClip;
          }
          iVar18 = 0;
          if (0 < iVar23) {
            iVar18 = iVar23;
          }
          uVar11 = (ulong)(uVar9 - iVar18);
        }
      }
      else {
        if ((int)uVar14 < ZvgENC.yMinClip) {
          return;
        }
        if (ZvgENC.yMaxClip < (int)yStart_00) {
          return;
        }
        iVar18 = uVar14 - ZvgENC.yMaxClip;
        uVar22 = ZvgENC.yMaxClip;
        if (iVar18 < 1) {
          iVar18 = 0;
          uVar22 = uVar14;
        }
        uVar14 = uVar22;
        uVar22 = iVar23 - iVar18;
        if (bVar6 || bVar7) {
          iVar23 = ZvgENC.yMinClip - yStart_00;
          if (0 < iVar23) {
            yStart_00 = ZvgENC.yMinClip;
          }
          iVar18 = 0;
          if (0 < iVar23) {
            iVar18 = iVar23;
          }
          uVar22 = uVar22 - iVar18;
        }
        uVar11 = (ulong)uVar22;
      }
      uVar10 = (uint)uVar11;
      if (uVar10 == 0) goto LAB_00102a1a;
      if ((uVar8 & 4) != 0) {
        if ((int)xStart_00 < ZvgENC.xMinSpot) {
          ZvgENC.xMinSpot = xStart_00;
        }
        if (ZvgENC.xMaxSpot < (int)xStart_00) {
          ZvgENC.xMaxSpot = xStart_00;
        }
        if ((int)yStart_00 < ZvgENC.yMinSpot) {
          ZvgENC.yMinSpot = yStart_00;
        }
        if (ZvgENC.yMaxSpot < (int)yStart_00) {
          ZvgENC.yMaxSpot = yStart_00;
        }
        if ((int)uVar14 < ZvgENC.yMinSpot) {
          ZvgENC.yMinSpot = uVar14;
        }
        if (ZvgENC.yMaxSpot < (int)uVar14) {
          ZvgENC.yMaxSpot = uVar14;
        }
      }
      bVar15 = bVar4 | 0x20;
      if (0xff < uVar10) {
        bVar15 = bVar4;
      }
      uVar12 = (ulong)ZvgENC.encCount;
      ZvgENC.encCount = ZvgENC.encCount + 1;
      ZvgENC.encBfr[uVar12] = bVar2 | bVar15 | 6;
      if ((bVar15 & 0x40) != 0) {
        uVar12 = (ulong)ZvgENC.encCount;
        ZvgENC.encCount = ZvgENC.encCount + 1;
        ZvgENC.encBfr[uVar12] = ZvgENC.encColor._1_1_;
        uVar12 = (ulong)ZvgENC.encCount;
        ZvgENC.encCount = ZvgENC.encCount + 1;
        ZvgENC.encBfr[uVar12] = (uchar)ZvgENC.encColor;
      }
      if (0x7f < bVar15) {
        uVar12 = (ulong)ZvgENC.encCount;
        ZvgENC.encCount = ZvgENC.encCount + 1;
        ZvgENC.encBfr[uVar12] = uVar17;
        uVar12 = (ulong)ZvgENC.encCount;
        ZvgENC.encCount = ZvgENC.encCount + 1;
        ZvgENC.encBfr[uVar12] = (byte)(yStart_00 >> 8) & 0xf | (byte)(xStart_00 >> 4) & 0xf0;
        uVar12 = (ulong)ZvgENC.encCount;
        ZvgENC.encCount = ZvgENC.encCount + 1;
        ZvgENC.encBfr[uVar12] = (uchar)yStart_00;
      }
      if ((bVar15 & 0x20) != 0) goto LAB_0010320a;
      bVar13 = (byte)(uVar11 >> 8) & 0xf;
      yStart_00 = uVar14;
      uVar22 = xStart_00;
    }
    else {
      bVar13 = (byte)(uVar5 >> 8);
      if (uVar10 == uVar5) {
        if ((uVar8 & 4) != 0) {
          if ((int)xStart_00 < ZvgENC.xMinSpot) {
            ZvgENC.xMinSpot = xStart_00;
          }
          if (ZvgENC.xMaxSpot < (int)xStart_00) {
            ZvgENC.xMaxSpot = xStart_00;
          }
          if ((int)uVar22 < ZvgENC.xMinSpot) {
            ZvgENC.xMinSpot = uVar22;
          }
          if (ZvgENC.xMaxSpot < (int)uVar22) {
            ZvgENC.xMaxSpot = uVar22;
          }
          if ((int)yStart_00 < ZvgENC.yMinSpot) {
            ZvgENC.yMinSpot = yStart_00;
          }
          if (ZvgENC.yMaxSpot < (int)yStart_00) {
            ZvgENC.yMaxSpot = yStart_00;
          }
          if ((int)uVar14 < ZvgENC.yMinSpot) {
            ZvgENC.yMinSpot = uVar14;
          }
          if (ZvgENC.yMaxSpot < (int)uVar14) {
            ZvgENC.yMaxSpot = uVar14;
          }
        }
        bVar16 = bVar4 | 0x20;
        if (0xff < uVar5) {
          bVar16 = bVar4;
        }
        uVar12 = (ulong)ZvgENC.encCount;
        ZvgENC.encCount = ZvgENC.encCount + 1;
        ZvgENC.encBfr[uVar12] = bVar2 + ((int)uVar22 < (int)xStart_00) * '\x02' | bVar16;
        if ((bVar16 & 0x40) != 0) {
          uVar12 = (ulong)ZvgENC.encCount;
          ZvgENC.encCount = ZvgENC.encCount + 1;
          ZvgENC.encBfr[uVar12] = ZvgENC.encColor._1_1_;
          uVar12 = (ulong)ZvgENC.encCount;
          ZvgENC.encCount = ZvgENC.encCount + 1;
          ZvgENC.encBfr[uVar12] = (uchar)ZvgENC.encColor;
        }
        if (0x7f < bVar16) {
          uVar12 = (ulong)ZvgENC.encCount;
          ZvgENC.encCount = ZvgENC.encCount + 1;
          ZvgENC.encBfr[uVar12] = uVar17;
          uVar12 = (ulong)ZvgENC.encCount;
          ZvgENC.encCount = ZvgENC.encCount + 1;
          ZvgENC.encBfr[uVar12] = bVar15 & 0xf | (byte)(xStart_00 >> 4) & 0xf0;
          uVar12 = (ulong)ZvgENC.encCount;
          ZvgENC.encCount = ZvgENC.encCount + 1;
          ZvgENC.encBfr[uVar12] = uVar21;
        }
        xStart_00 = uVar22;
        if ((bVar16 & 0x20) != 0) goto LAB_0010320a;
        bVar13 = bVar13 & 0xf;
        yStart_00 = uVar14;
        uVar10 = uVar5;
      }
      else {
        if ((uVar8 & 4) != 0) {
          if ((int)xStart_00 < ZvgENC.xMinSpot) {
            ZvgENC.xMinSpot = xStart_00;
          }
          if (ZvgENC.xMaxSpot < (int)xStart_00) {
            ZvgENC.xMaxSpot = xStart_00;
          }
          if ((int)uVar22 < ZvgENC.xMinSpot) {
            ZvgENC.xMinSpot = uVar22;
          }
          if (ZvgENC.xMaxSpot < (int)uVar22) {
            ZvgENC.xMaxSpot = uVar22;
          }
          if ((int)yStart_00 < ZvgENC.yMinSpot) {
            ZvgENC.yMinSpot = yStart_00;
          }
          if (ZvgENC.yMaxSpot < (int)yStart_00) {
            ZvgENC.yMaxSpot = yStart_00;
          }
          if ((int)uVar14 < ZvgENC.yMinSpot) {
            ZvgENC.yMinSpot = uVar14;
          }
          if (ZvgENC.yMaxSpot < (int)uVar14) {
            ZvgENC.yMaxSpot = uVar14;
          }
        }
        bVar16 = bVar2 + ((int)uVar22 < (int)xStart_00) * '\x02';
        if (uVar10 < uVar5) {
          auVar3._8_8_ = 0;
          auVar3._0_8_ = uVar11;
          auVar3 = (ZEXT416(uVar10) << 0x10) / auVar3;
          bVar19 = bVar4 | 8;
          if (uVar5 < 0x80) {
            bVar19 = bVar4 | 0x28;
          }
          uVar12 = (ulong)ZvgENC.encCount;
          ZvgENC.encCount = ZvgENC.encCount + 1;
          ZvgENC.encBfr[uVar12] = bVar16 | bVar19;
          if ((bVar19 & 0x40) != 0) {
            uVar12 = (ulong)ZvgENC.encCount;
            ZvgENC.encCount = ZvgENC.encCount + 1;
            ZvgENC.encBfr[uVar12] = ZvgENC.encColor._1_1_;
            uVar12 = (ulong)ZvgENC.encCount;
            ZvgENC.encCount = ZvgENC.encCount + 1;
            ZvgENC.encBfr[uVar12] = (uchar)ZvgENC.encColor;
          }
          if (0x7f < bVar19) {
            uVar12 = (ulong)ZvgENC.encCount;
            ZvgENC.encCount = ZvgENC.encCount + 1;
            ZvgENC.encBfr[uVar12] = uVar17;
            uVar12 = (ulong)ZvgENC.encCount;
            ZvgENC.encCount = ZvgENC.encCount + 1;
            ZvgENC.encBfr[uVar12] = bVar15 & 0xf | (byte)(xStart_00 >> 4) & 0xf0;
            uVar12 = (ulong)ZvgENC.encCount;
            ZvgENC.encCount = ZvgENC.encCount + 1;
            ZvgENC.encBfr[uVar12] = uVar21;
          }
          uVar12 = (ulong)ZvgENC.encCount;
          ZvgENC.encCount = ZvgENC.encCount + 1;
          ZvgENC.encBfr[uVar12] = auVar3[1];
          xStart_00 = uVar22;
          if ((bVar19 & 0x20) != 0) goto LAB_0010320a;
          bVar13 = bVar13 & 0xf | auVar3[0] & 0xf0;
          yStart_00 = uVar14;
          uVar10 = uVar5;
        }
        else {
          auVar3 = (ZEXT416(uVar5) << 0x10) / ZEXT416(uVar10);
          bVar13 = bVar4 | 8;
          if (uVar10 < 0x80) {
            bVar13 = bVar4 | 0x28;
          }
          uVar11 = (ulong)ZvgENC.encCount;
          ZvgENC.encCount = ZvgENC.encCount + 1;
          ZvgENC.encBfr[uVar11] = bVar16 | bVar13 | 4;
          if ((bVar13 & 0x40) != 0) {
            uVar11 = (ulong)ZvgENC.encCount;
            ZvgENC.encCount = ZvgENC.encCount + 1;
            ZvgENC.encBfr[uVar11] = ZvgENC.encColor._1_1_;
            uVar11 = (ulong)ZvgENC.encCount;
            ZvgENC.encCount = ZvgENC.encCount + 1;
            ZvgENC.encBfr[uVar11] = (uchar)ZvgENC.encColor;
          }
          if (0x7f < bVar13) {
            uVar11 = (ulong)ZvgENC.encCount;
            ZvgENC.encCount = ZvgENC.encCount + 1;
            ZvgENC.encBfr[uVar11] = uVar17;
            uVar11 = (ulong)ZvgENC.encCount;
            ZvgENC.encCount = ZvgENC.encCount + 1;
            ZvgENC.encBfr[uVar11] = bVar15 & 0xf | (byte)(xStart_00 >> 4) & 0xf0;
            uVar11 = (ulong)ZvgENC.encCount;
            ZvgENC.encCount = ZvgENC.encCount + 1;
            ZvgENC.encBfr[uVar11] = uVar21;
          }
          uVar11 = (ulong)ZvgENC.encCount;
          ZvgENC.encCount = ZvgENC.encCount + 1;
          ZvgENC.encBfr[uVar11] = auVar3[1];
          uVar11 = (ulong)uVar10;
          xStart_00 = uVar22;
          if ((bVar13 & 0x20) != 0) goto LAB_0010320a;
          bVar13 = (byte)(uVar10 >> 8) & 0xf | auVar3[0] & 0xf0;
          yStart_00 = uVar14;
        }
      }
    }
LAB_001031ee:
    uVar11 = (ulong)ZvgENC.encCount;
    ZvgENC.encCount = ZvgENC.encCount + 1;
    ZvgENC.encBfr[uVar11] = bVar13;
  }
  uVar11 = (ulong)uVar10;
  xStart_00 = uVar22;
  uVar14 = yStart_00;
LAB_0010320a:
  uVar12 = (ulong)ZvgENC.encCount;
  ZvgENC.encCount = ZvgENC.encCount + 1;
  ZvgENC.encBfr[uVar12] = (uchar)uVar11;
  ZvgENC.zColor = ZvgENC.encColor;
  ZvgENC.yPos = uVar14;
  ZvgENC.xPos = xStart_00;
  return;
}

Assistant:

void zvgEnc( int xStart, int yStart, int xEnd, int yEnd)
{
	uint	xLen, yLen;
	uint	xSign, ySign, vRatio;
	uint	zvgCmd;
	int	diff;

	ZvgENC.vecCount++;						// count number of vectors

	// check for axis flips

	if (ZvgENC.encFlags & ENCF_FLIPX)
	{	xStart = ~xStart;
		xEnd = ~xEnd;
	}

	if (ZvgENC.encFlags & ENCF_FLIPY)
	{	yStart = ~yStart;
		yEnd = ~yEnd;
	}

	// Check if NOT a point, vertical or horizontal line, then
	// clip the line the old fashion way.

	if (xStart != xEnd && yStart != yEnd)
		if (!clipLine( &xStart, &yStart, &xEnd, &yEnd))
			return;								// if vector rejected, just return

	// Check for point

	if (xStart == xEnd && yStart == yEnd)
	{
		// clip data point

		if (xStart < ZvgENC.xMinClip)
			return;								// do nothing if outside window

		if (xStart > ZvgENC.xMaxClip)
			return;								// do nothing if outside window

		if (yStart < ZvgENC.yMinClip)
			return;								// do nothing if outside window

		if (yStart > ZvgENC.yMaxClip)
			return;								// do nothing if outside window

		// encode data point
		zvgEncPointSK( xStart, yStart, ZvgENC.encColor);
		return;
	}

	// Handle vectors.

	zvgCmd = zbVECTOR;						// indicate a vector is being drawn

	// Check to see if color has changed

	if (ZvgENC.encColor != ZvgENC.zColor)
		zvgCmd |= zbCOLOR;					// indicate color information is to be sent

	// Check to see if start of this vector is same as current trace position
	// (if start point is the same a previous, then it does not need to be clipped)

	if (xStart != ZvgENC.xPos || yStart != ZvgENC.yPos)
		zvgCmd |= zbABS;						// if not, the starting points must be sent

	// get direction of X and Y axis, and their respective lengths

	if (xEnd < xStart)
	{	xSign = 1;								// moves from right to left
		xLen = xStart - xEnd;				// get length of X axis
	}
	else
	{	xSign = 0;								// moves from left to right
		xLen = xEnd - xStart;				// get length of X axis
	}

	if (yEnd < yStart)
	{	ySign = 1;								// moves downward
		yLen = yStart - yEnd;				// get length of Y axis
	}
	else
	{	ySign = 0;	 							// moves upward
		yLen = yEnd - yStart;				// get length of Y axis
	}

	// check for horizontal line

	if (yLen == 0)
	{
		// clip vector if needed

		if (yStart < ZvgENC.yMinClip || yStart > ZvgENC.yMaxClip)
			return; 						// reject vector

		// Does vector move from right to left?

		if (xSign)
		{
			if (xEnd > ZvgENC.xMaxClip || xStart < ZvgENC.xMinClip)
				return;					// reject vector

			diff = ZvgENC.xMinClip - xEnd;

			if (diff > 0)
			{	xEnd += diff;			// clip line
				xLen -= diff;
			}

			// if new starting points sent, they must be clipped

			if (zvgCmd & zbABS)
			{
				diff = xStart - ZvgENC.xMaxClip;

				if (diff > 0)
				{	xStart -= diff;	// clip line
					xLen -= diff;
				}
			}
		}

		// Else, vector moves from left to right

		else
		{
			if (xEnd < ZvgENC.xMinClip || xStart > ZvgENC.xMaxClip)
				return;					// reject vector

			diff = xEnd - ZvgENC.xMaxClip;

			if (diff > 0)
			{	xEnd -= diff;			// clip line
				xLen -= diff;
			}

			// if new starting points sent, they must be clipped

			if (zvgCmd & zbABS)
			{
				diff = ZvgENC.xMinClip - xStart;

				if (diff > 0)
				{	xStart += diff;	// clip line
					xLen -= diff;
				}
			}
		}

		// check if vector clipped to a point, if so, encode point

		if (xLen == 0)
		{	zvgEncPointSK( xStart, yStart, ZvgENC.encColor);
			return;						// done sending point, return
		}

		if (ZvgENC.encFlags & ENCF_SPOTKILL)
		{
			CHECK_X_SPOT( xStart)
			CHECK_X_SPOT( xEnd)
			CHECK_Y_SPOT( yStart)
		}

		// if length fits in 8 bits, use short version of command

		if (xLen < 256)
			zvgCmd |= zbSHORT;			// use short length

		// send command

		ZvgENC.encBfr[ZvgENC.encCount++] = zvgCmd | zbHZVT | xSign;

		// send color if needed

		if (zvgCmd & zbCOLOR)
			sendColor( ZvgENC.encColor);

		// send starting positions if needed

		if (zvgCmd & zbABS)
			sendXY( xStart, yStart);

		// send length, short or long

		if (zvgCmd & zbSHORT)
			sendLen8( xLen);
	
		else
			sendLen12( xLen);
	}

	// check for vertical line

	else if (xLen == 0)
	{
		// clip vector if needed

		if (xStart < ZvgENC.xMinClip || xStart > ZvgENC.xMaxClip)
			return; 						// reject vector

		// Does vector move downward?

		if (ySign)
		{
			if (yEnd > ZvgENC.yMaxClip || yStart < ZvgENC.yMinClip)
				return;					// reject vector

			diff = ZvgENC.yMinClip - yEnd;

			if (diff > 0)
			{	yEnd += diff;			// clip line
				yLen -= diff;
			}

			// if new starting points sent, they must be clipped

			if (zvgCmd & zbABS)
			{
				diff = yStart - ZvgENC.yMaxClip;

				if (diff > 0)
				{	yStart -= diff;	// clip line
					yLen -= diff;
				}
			}
		}

		// Else, vector moves upward

		else
		{
			if (yEnd < ZvgENC.yMinClip || yStart > ZvgENC.yMaxClip)
				return;					// reject vector

			diff = yEnd - ZvgENC.yMaxClip;

			if (diff > 0)
			{	yEnd -= diff;			// clip line
				yLen -= diff;
			}

			// if new starting points sent, they must be clipped

			if (zvgCmd & zbABS)
			{
				diff = ZvgENC.yMinClip - yStart;

				if (diff > 0)
				{	yStart += diff;	// clip line
					yLen -= diff;
				}
			}
		}

		// check if vector clipped to a point, if so, encode point

		if (yLen == 0)
		{	zvgEncPointSK( xStart, yStart, ZvgENC.encColor);
			return;						// done sending point, return
		}

		if (ZvgENC.encFlags & ENCF_SPOTKILL)
		{
			CHECK_X_SPOT( xStart)
			CHECK_Y_SPOT( yStart)
			CHECK_Y_SPOT( yEnd)
		}

		// if length fits in 8 bits, use short version of command

		if (yLen < 256)
			zvgCmd |= zbSHORT;			// use short length

		// send command

		ZvgENC.encBfr[ZvgENC.encCount++] = zvgCmd | zbHZVT | zbVERT | ySign;

		// send color if needed

		if (zvgCmd & zbCOLOR)		
			sendColor( ZvgENC.encColor);

		// send starting positions if needed

		if (zvgCmd & zbABS)
			sendXY( xStart, yStart);

		// send length, short or long

		if (zvgCmd & zbSHORT)
			sendLen8( yLen);
	
		else
			sendLen12( yLen);
	}

	// look for 45 degree angle

	else if (yLen == xLen)
	{
		// spot kill test

		if (ZvgENC.encFlags & ENCF_SPOTKILL)
		{
			CHECK_X_SPOT( xStart)
			CHECK_X_SPOT( xEnd)
			CHECK_Y_SPOT( yStart)
			CHECK_Y_SPOT( yEnd)
		}

		// if length fits in 8 bits, send short length

		if (xLen < 256)
			zvgCmd |= zbSHORT;				// use short length

		// send ZVG command, and direction

		ZvgENC.encBfr[ZvgENC.encCount++] = zvgCmd | (xSign << 1) | ySign;

		if (zvgCmd & zbCOLOR)
			sendColor( ZvgENC.encColor);

		// if starting points required, send them

		if (zvgCmd & zbABS)
			sendXY( xStart, yStart);

		// if short length, send it

		if (zvgCmd & zbSHORT)
			sendLen8( xLen);
	
		// else, send long length

		else
			sendLen12( xLen);
	}

	// If not 45 degree angle, vertical, or horizontal, then ratio must be
	// calculated.

	else
	{
		// spot kill test

		if (ZvgENC.encFlags & ENCF_SPOTKILL)
		{
			CHECK_X_SPOT( xStart)
			CHECK_X_SPOT( xEnd)
			CHECK_Y_SPOT( yStart)
			CHECK_Y_SPOT( yEnd)
		}

		zvgCmd |= zbRATIO;					// indicate ratio being sent

		if (xLen > yLen)
		{
			// calculate integer ratio

			vRatio = (uint)(((ulong)yLen << 16) / xLen);

			// if length can fit in 7 bits, send short version of command

			if (xLen < 128)
				zvgCmd |= zbSHORT;			// use short length

			// send command

			ZvgENC.encBfr[ZvgENC.encCount++] = zvgCmd | (xSign << 1) | ySign;

			// send color if needed
		
			if (zvgCmd & zbCOLOR)
				sendColor( ZvgENC.encColor);

			// send start positions if needed

			if (zvgCmd & zbABS)
				sendXY( xStart, yStart);

			// send length and ratio, short or long

			if (zvgCmd & zbSHORT)
				sendRatioLen8( vRatio, xLen);
	
			else
				sendRatioLen12( vRatio, xLen);
		}

		// Else, Y length is greater than X length.

		else
		{
			// calculate ratio

			vRatio = (unsigned int)(((long)xLen << 16) / yLen);

			// if length can fit in 7 bits, send short version of command

			if (yLen < 128)
				zvgCmd |= zbSHORT;			// use short length

			// send command

			ZvgENC.encBfr[ZvgENC.encCount++] = zvgCmd | zbYLEN | (xSign << 1) | ySign;

			// send color if needed
		
			if (zvgCmd & zbCOLOR)
				sendColor( ZvgENC.encColor);

			// send start positions if needed

			if (zvgCmd & zbABS)
				sendXY( xStart, yStart);

			// send length and ratio, short or long

			if (zvgCmd & zbSHORT)
				sendRatioLen8( vRatio, yLen);
	
			else
				sendRatioLen12( vRatio, yLen);
		}
	}
	ZvgENC.xPos = xEnd;						// new position is end of vector
	ZvgENC.yPos = yEnd;
	ZvgENC.zColor = ZvgENC.encColor;		// save new color
}